

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O1

int get_attr_id(attr_list list,int item_no,atom_t *item)

{
  byte bVar1;
  attr_list p_Var2;
  int_attr_struct *piVar3;
  atom_t aVar4;
  uint uVar5;
  long lVar6;
  bool bVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  
  uVar11 = (ulong)(uint)item_no;
  if (global_as_lock != (atl_lock_func)0x0) {
    (*global_as_lock)(global_as_lock_data);
  }
  if (global_as == (atom_server)0x0) {
    global_as = init_atom_server(prefill_atom_cache);
    if (init_global_atom_server_first == '\0') {
      init_global_atom_server_first = '\x01';
    }
  }
  if (global_as_unlock != (atl_lock_func)0x0) {
    (*global_as_unlock)(global_as_lock_data);
  }
  uVar5 = 0;
  if (list != (attr_list)0x0 && -1 < item_no) {
    if (list->list_of_lists == 0) {
      piVar3 = (list->l).list.iattrs;
      bVar1 = piVar3->int_attr_count;
      uVar5 = 0;
      if (item_no < (int)((uint)bVar1 + (uint)bVar1)) {
        if (item_no < (int)(uint)bVar1) {
          aVar4 = piVar3->iattr[uVar11].attr_id;
        }
        else {
          aVar4 = (list->l).list.attributes[(long)item_no - (ulong)bVar1].attr_id;
        }
        *item = aVar4;
        uVar5 = 1;
      }
    }
    else {
      iVar10 = (list->l).lists.sublist_count;
      bVar7 = 0 < iVar10;
      if (0 < iVar10) {
        lVar6 = 0;
        do {
          p_Var2 = (list->l).lists.lists[lVar6];
          piVar3 = (p_Var2->l).list.iattrs;
          bVar1 = piVar3->int_attr_count;
          iVar12 = (uint)bVar1 + (uint)bVar1;
          iVar10 = (int)uVar11;
          uVar9 = (ulong)(uint)(iVar10 - iVar12);
          if (iVar10 - iVar12 == 0 || iVar10 < iVar12) {
            if (iVar10 < (int)(uint)bVar1) {
              *item = piVar3->iattr[iVar10].attr_id;
              uVar9 = uVar11;
            }
            else {
              uVar9 = (long)iVar10 - (ulong)bVar1;
              *item = (p_Var2->l).list.attributes[uVar9].attr_id;
            }
          }
          if (iVar10 <= iVar12) break;
          lVar6 = lVar6 + 1;
          lVar8 = (long)(list->l).lists.sublist_count;
          uVar11 = uVar9 & 0xffffffff;
          bVar7 = lVar6 < lVar8;
        } while (lVar6 < lVar8);
      }
      uVar5 = (uint)bVar7;
    }
  }
  return uVar5;
}

Assistant:

extern int
get_attr_id(attr_list list, int item_no, atom_t *item)
{

    atl_lock();
    init_global_atom_server(&global_as);
    atl_unlock();

    if (item_no < 0) return 0;

    if (list == NULL) return 0;

    if (!list->list_of_lists) {
        int int_attr_count = list->l.list.iattrs->int_attr_count;
        int other_attr_count = list->l.list.iattrs->int_attr_count;
        int total_attr_count = int_attr_count + other_attr_count;

        if (item_no >= total_attr_count) return 0;

        if (item_no < int_attr_count) {
            *item = list->l.list.iattrs->iattr[item_no].attr_id;
	    return 1;
        } else {
            item_no -= int_attr_count;
            *item = list->l.list.attributes[item_no].attr_id;
	    return 1;
        }
    } else {
        int i;
        for (i=0; i<list->l.lists.sublist_count; i++) {
            attr_list atl = list->l.lists.lists[i];
            int int_attr_count = atl->l.list.iattrs->int_attr_count;
            int other_attr_count = atl->l.list.iattrs->int_attr_count;
            int total_attr_count = int_attr_count + other_attr_count;

            if (item_no > total_attr_count) {
                item_no -= total_attr_count;
	    } else {
                if (item_no < int_attr_count) {
                    *item = atl->l.list.iattrs->iattr[item_no].attr_id;
		    return 1;
                } else {
                    item_no -= int_attr_count;
                    *item = atl->l.list.attributes[item_no].attr_id;
		    return 1;
                }
            }
        }
    }
    return 0;
}